

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

bool google::protobuf::safe_strtod(char *str,double *value)

{
  bool bVar1;
  double dVar2;
  char *endptr;
  byte *local_20;
  
  dVar2 = io::NoLocaleStrtod(str,(char **)&local_20);
  *value = dVar2;
  if (local_20 != (byte *)str) {
    for (; (*local_20 - 9 < 5 || (*local_20 == 0x20)); local_20 = local_20 + 1) {
    }
  }
  if (*str == '\0') {
    bVar1 = false;
  }
  else {
    bVar1 = *local_20 == 0;
  }
  return bVar1;
}

Assistant:

bool safe_strtod(const char* str, double* value) {
  char* endptr;
  *value = io::NoLocaleStrtod(str, &endptr);
  if (endptr != str) {
    while (ascii_isspace(*endptr)) ++endptr;
  }
  // Ignore range errors from strtod.  The values it
  // returns on underflow and overflow are the right
  // fallback in a robust setting.
  return *str != '\0' && *endptr == '\0';
}